

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack28_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5 = *(undefined1 (*) [16])(in + 1);
  auVar4 = vpmovsxbd_avx(ZEXT416(0x2010004));
  uVar1 = *in;
  uVar2 = *(ulong *)(in + 5);
  *out = uVar1 & 0xfffffff;
  auVar3 = vpermi2d_avx512vl(auVar4,auVar5,ZEXT416(uVar1));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar4 = vpalignr_avx(auVar6,auVar5,0xc);
  auVar6 = vpsllvd_avx2(auVar6,_DAT_0019b870);
  auVar3 = vpshldvd_avx512_vbmi2(auVar5,auVar3,_DAT_00199d10);
  auVar5 = vpsrlvd_avx2(auVar4,_DAT_0019b7d0);
  auVar4._8_4_ = 0xfffffff;
  auVar4._0_8_ = 0xfffffff0fffffff;
  auVar4._12_4_ = 0xfffffff;
  auVar4 = vpandd_avx512vl(auVar3,auVar4);
  auVar3._8_4_ = 0xff00000;
  auVar3._0_8_ = 0xf0000000ff00000;
  auVar3._12_4_ = 0xf000000;
  auVar5 = vpternlogq_avx512vl(auVar6,auVar5,auVar3,0xec);
  *(undefined1 (*) [16])(out + 1) = auVar4;
  *(long *)(out + 5) = auVar5._0_8_;
  out[7] = (uint)(uVar2 >> 0x24);
  return in + 7;
}

Assistant:

const uint32_t *__fastunpack28_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 24)) << (28 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 20)) << (28 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 16)) << (28 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 12)) << (28 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 8)) << (28 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  *out |= ((*in) % (1U << 4)) << (28 - 4);
  out++;
  *out = ((*in) >> 4);
  ++in;
  out++;

  return in;
}